

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

int Mvc_UtilsCheckUnusedZeros(Mvc_Cover_t *pCover)

{
  uint uVar1;
  ulong uVar2;
  Mvc_Cube_t *pMVar3;
  
  pMVar3 = (pCover->lCubes).pHead;
  if (pMVar3 != (Mvc_Cube_t *)0x0) {
    uVar2 = 0;
    do {
      uVar1 = *(uint *)&pMVar3->field_0x8 >> 0x18 & 0x3f;
      if (uVar1 != 0) {
        if (pMVar3->pData[*(uint *)&pMVar3->field_0x8 & 0xffffff] >> (-(char)uVar1 & 0x1fU) != 0) {
          uVar1 = Mvc_CoverReadCubeNum(pCover);
          printf("Cube %2d out of %2d contains dirty bits.\n",uVar2,(ulong)uVar1);
        }
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      pMVar3 = pMVar3->pNext;
    } while (pMVar3 != (Mvc_Cube_t *)0x0);
  }
  return 1;
}

Assistant:

int Mvc_UtilsCheckUnusedZeros( Mvc_Cover_t * pCover )
{
    unsigned Unsigned;
    Mvc_Cube_t * pCube;
    int nCubes;

    nCubes = 0;
    Mvc_CoverForEachCube( pCover, pCube )
    {
        if ( pCube->nUnused == 0 )
            continue;

        Unsigned = ( pCube->pData[pCube->iLast] & 
                    (BITS_FULL << (32-pCube->nUnused)) );
        if( Unsigned )
        {
            printf( "Cube %2d out of %2d contains dirty bits.\n", nCubes, 
                Mvc_CoverReadCubeNum(pCover) );
        }
        nCubes++;
    }
    return 1;
}